

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svgtextelement.cpp
# Opt level: O0

void __thiscall
lunasvg::SVGTextPositioningElement::SVGTextPositioningElement
          (SVGTextPositioningElement *this,Document *document,ElementID id)

{
  ElementID id_local;
  Document *document_local;
  SVGTextPositioningElement *this_local;
  
  SVGGraphicsElement::SVGGraphicsElement(&this->super_SVGGraphicsElement,document,id);
  (this->super_SVGGraphicsElement).super_SVGElement.super_SVGNode._vptr_SVGNode =
       (_func_int **)&PTR__SVGTextPositioningElement_001c4138;
  SVGLengthList::SVGLengthList(&this->m_x,X,Horizontal,Allow);
  SVGLengthList::SVGLengthList(&this->m_y,Y,Vertical,Allow);
  SVGLengthList::SVGLengthList(&this->m_dx,Dx,Horizontal,Allow);
  SVGLengthList::SVGLengthList(&this->m_dy,Dy,Vertical,Allow);
  SVGNumberList::SVGNumberList(&this->m_rotate,Rotate);
  SVGLength::SVGLength(&this->m_textLength,TextLength,Horizontal,Forbid,0.0,None);
  SVGEnumeration<lunasvg::LengthAdjust>::SVGEnumeration(&this->m_lengthAdjust,LengthAdjust,Spacing);
  Font::Font(&this->m_font);
  SVGPaintServer::SVGPaintServer(&this->m_fill);
  SVGPaintServer::SVGPaintServer(&this->m_stroke);
  this->m_stroke_width = 1.0;
  this->m_baseline_offset = 0.0;
  this->m_alignment_baseline = Auto;
  this->m_dominant_baseline = Auto;
  this->m_text_anchor = Start;
  this->m_white_space = Default;
  this->m_direction = Ltr;
  SVGElement::addProperty((SVGElement *)this,&(this->m_x).super_SVGProperty);
  SVGElement::addProperty((SVGElement *)this,&(this->m_y).super_SVGProperty);
  SVGElement::addProperty((SVGElement *)this,&(this->m_dx).super_SVGProperty);
  SVGElement::addProperty((SVGElement *)this,&(this->m_dy).super_SVGProperty);
  SVGElement::addProperty((SVGElement *)this,&(this->m_rotate).super_SVGProperty);
  SVGElement::addProperty((SVGElement *)this,&(this->m_textLength).super_SVGProperty);
  SVGElement::addProperty((SVGElement *)this,&(this->m_lengthAdjust).super_SVGProperty);
  return;
}

Assistant:

SVGTextPositioningElement::SVGTextPositioningElement(Document* document, ElementID id)
    : SVGGraphicsElement(document, id)
    , m_x(PropertyID::X, LengthDirection::Horizontal, LengthNegativeMode::Allow)
    , m_y(PropertyID::Y, LengthDirection::Vertical, LengthNegativeMode::Allow)
    , m_dx(PropertyID::Dx, LengthDirection::Horizontal, LengthNegativeMode::Allow)
    , m_dy(PropertyID::Dy, LengthDirection::Vertical, LengthNegativeMode::Allow)
    , m_rotate(PropertyID::Rotate)
    , m_textLength(PropertyID::TextLength, LengthDirection::Horizontal, LengthNegativeMode::Forbid)
    , m_lengthAdjust(PropertyID::LengthAdjust, LengthAdjust::Spacing)
{
    addProperty(m_x);
    addProperty(m_y);
    addProperty(m_dx);
    addProperty(m_dy);
    addProperty(m_rotate);
    addProperty(m_textLength);
    addProperty(m_lengthAdjust);
}